

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O0

typed_address<pstore::index::header_block> __thiscall
pstore::index::
hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
::flush(hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
        *this,transaction_base *transaction,uint generation)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  database *this_00;
  internal_node *this_01;
  size_t sVar4;
  pointer this_02;
  address local_30;
  uint local_24;
  transaction_base *ptStack_20;
  uint generation_local;
  transaction_base *transaction_local;
  hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
  *this_local;
  typed_address<pstore::index::header_block> header_addr;
  
  uVar1 = this->revision_;
  local_24 = generation;
  ptStack_20 = transaction;
  transaction_local = (transaction_base *)this;
  this_00 = transaction_base::db(transaction);
  uVar3 = database::get_current_revision(this_00);
  if (uVar1 != uVar3) {
    raise<pstore::error_code>(index_not_latest_revision);
  }
  bVar2 = details::index_pointer::is_address((index_pointer *)&(this->root_).addr_);
  if (!bVar2) {
    bVar2 = details::index_pointer::is_internal((index_pointer *)&(this->root_).addr_);
    if (!bVar2) {
      assert_failed("root_.is_internal ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/hamt_map.hpp"
                    ,0x412);
    }
    this_01 = details::index_pointer::untag<pstore::index::details::internal_node*,void>
                        ((index_pointer *)&(this->root_).addr_);
    local_30 = details::internal_node::flush(this_01,ptStack_20,0);
    details::index_pointer::operator=((index_pointer *)&(this->root_).addr_,&local_30);
    bVar2 = details::index_pointer::is_address((index_pointer *)&(this->root_).addr_);
    if (!bVar2) {
      assert_failed("root_.is_address ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/hamt_map.hpp"
                    ,0x414);
    }
  }
  sVar4 = size(this);
  if (sVar4 == 0) {
    this_local = (hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
                  *)typed_address<pstore::index::header_block>::null();
  }
  else {
    this_local = (hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
                  *)write_header_block(this,ptStack_20);
  }
  this_02 = std::
            unique_ptr<pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>,_std::default_delete<pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>_>_>
            ::operator->(&this->internals_container_);
  chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>::clear(this_02);
  this->revision_ = local_24;
  return (typed_address<pstore::index::header_block>)(address)this_local;
}

Assistant:

typed_address<header_block>
        hamt_map<KeyType, ValueType, Hash, KeyEqual>::flush (transaction_base & transaction,
                                                             unsigned const generation) {
            if (revision_ != transaction.db ().get_current_revision ()) {
                raise (error_code::index_not_latest_revision);
            }

            // If the root is a leaf, there's nothing to do. If not, we start to recursively flush
            // the tree.
            if (!root_.is_address ()) {
                PSTORE_ASSERT (root_.is_internal ());
                root_ = root_.untag<internal_node *> ()->flush (transaction, 0 /*shifts*/);
                PSTORE_ASSERT (root_.is_address ());
                // Don't delete the internal node here. They are owned by internals_container_. If
                // this ever changes, then use something like 'delete internal' here.
            }

            auto const header_addr = this->size () > 0U ? this->write_header_block (transaction)
                                                        : typed_address<header_block>::null ();

            // Release all of the in-heap internal nodes that we have now flushed.
            internals_container_->clear ();

            // Update the revision number into which the index will be flushed.
            revision_ = generation;

            return header_addr;
        }